

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

int __thiscall nuraft::raft_server::shutdown(raft_server *this,int __fd,int __how)

{
  element_type *peVar1;
  int iVar2;
  int extraout_EAX;
  snapshot_io_mgr *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  mutex *__mutex;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> params;
  unique_lock<std::mutex> commit_lock;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])
                      (peVar1,CONCAT44(in_register_00000034,__fd),
                       CONCAT44(in_register_00000014,__how));
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"shutting down raft core");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1bf,(string *)&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  cancel_global_requests(this);
  nuraft::context::get_params((context *)&params);
  if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      use_bg_thread_for_snapshot_io_ == true) {
    this_00 = snapshot_io_mgr::instance();
    snapshot_io_mgr::drop_reqs(this_00,this);
  }
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&commit_lock,&this->commit_cv_lock_);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&commit_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"sent stop signal to the commit thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d2,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  cancel_schedulers(this);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"cancelled all schedulers.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d8,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  while (((this->commit_bg_stopped_)._M_base._M_i & 1U) == 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&guard,&this->commit_cv_lock_);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&guard);
    sched_yield();
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"commit thread stopped.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e2,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  drop_all_pending_commit_elems(this);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"all pending commit elements dropped.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e6,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  __mutex = &((this->ctx_)._M_t.
              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
              super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->ctx_lock_;
  std::mutex::lock(__mutex);
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(((this->ctx_)._M_t.
                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->logger_).
              super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(((this->ctx_)._M_t.
                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->rpc_listener_).
              super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(((this->ctx_)._M_t.
                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->rpc_cli_factory_).
              super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(((this->ctx_)._M_t.
                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"reset all pointers.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1f0,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  if ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    reset_srv_to_join(this);
  }
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    reset_srv_to_leave(this);
  }
  if ((this->bg_commit_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"joined terminated commit thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1ff,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  while ((this->bg_append_ea_ != (EventAwaiter *)0x0 &&
         (((this->append_bg_stopped_)._M_base._M_i & 1U) == 0))) {
    EventAwaiter::invoke(this->bg_append_ea_);
    sched_yield();
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"sent stop signal to background append thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x206,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  if ((this->bg_append_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::mutex::lock(&this->auto_fwd_reqs_lock_);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&guard,"clean up auto-forwarding queue: %zu elems",
                 (this->auto_fwd_reqs_).
                 super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                 ._M_impl._M_node._M_size);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x20e,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  std::__cxx11::
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::clear(&this->auto_fwd_reqs_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->auto_fwd_reqs_lock_);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"clean up auto-forwarding clients");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x212,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  cleanup_auto_fwd_pkgs(this);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&guard,"raft_server shutdown completed.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x215,&guard);
      std::__cxx11::string::~string((string *)&guard);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return extraout_EAX;
}

Assistant:

void raft_server::shutdown() {
    p_in("shutting down raft core");

    // If the global manager exists, cancel all pending requests.
    cancel_global_requests();

    // Cancel snapshot requests if exist.
    ptr<raft_params> params = ctx_->get_params();
    if (params->use_bg_thread_for_snapshot_io_) {
        snapshot_io_mgr::instance().drop_reqs(this);
    }

    // Terminate background commit thread.
    {   recur_lock(lock_);
        stopping_ = true;
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
    }

    p_in("sent stop signal to the commit thread.");

    // Cancel all scheduler tasks.
    // TODO: how do we guarantee all tasks are done?
    cancel_schedulers();

    p_in("cancelled all schedulers.");

    // Wait until background commit thread terminates.
    while (!commit_bg_stopped_) {
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
        std::this_thread::yield();
    }

    p_in("commit thread stopped.");

    drop_all_pending_commit_elems();

    p_in("all pending commit elements dropped.");

    // Clear shared_ptrs that the current server is holding.
    {   std::lock_guard<std::mutex> l(ctx_->ctx_lock_);
        ctx_->logger_.reset();
        ctx_->rpc_listener_.reset();
        ctx_->rpc_cli_factory_.reset();
        ctx_->scheduler_.reset();
    }

    p_in("reset all pointers.");

    // Server to join/leave.
    if (srv_to_join_) {
        reset_srv_to_join();
    }
    if (srv_to_leave_) {
        reset_srv_to_leave();
    }

    // Wait for BG commit thread.
    if (bg_commit_thread_.joinable()) {
        bg_commit_thread_.join();
    }

    p_in("joined terminated commit thread.");

    while (bg_append_ea_ && !append_bg_stopped_) {
        bg_append_ea_->invoke();
        std::this_thread::yield();
    }

    p_in("sent stop signal to background append thread.");

    if (bg_append_thread_.joinable()) {
        bg_append_thread_.join();
    }

    {
        auto_lock(auto_fwd_reqs_lock_);
        p_in("clean up auto-forwarding queue: %zu elems", auto_fwd_reqs_.size());
        auto_fwd_reqs_.clear();
    }

    p_in("clean up auto-forwarding clients");
    cleanup_auto_fwd_pkgs();

    p_in("raft_server shutdown completed.");
}